

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O2

void Kit_SopCreateInverse(Kit_Sop_t *cResult,Vec_Int_t *vInput,int nLits,Vec_Int_t *vMemory)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  int nWords;
  int i;
  
  nWords = vInput->nSize;
  cResult->nCubes = 0;
  puVar3 = Vec_IntFetch(vMemory,nWords);
  cResult->pCubes = puVar3;
  i = 0;
  if (nWords < 1) {
    nWords = i;
  }
  for (; nWords != i; i = i + 1) {
    uVar2 = Vec_IntEntry(vInput,i);
    iVar1 = cResult->nCubes;
    cResult->nCubes = iVar1 + 1;
    cResult->pCubes[iVar1] = ((uVar2 >> 1 | uVar2) & 0x55555555) * 3 ^ uVar2;
  }
  return;
}

Assistant:

void Kit_SopCreateInverse( Kit_Sop_t * cResult, Vec_Int_t * vInput, int nLits, Vec_Int_t * vMemory )
{
    unsigned uCube, uMask = 0;
    int i, nCubes = Vec_IntSize(vInput);
    // start the cover
    cResult->nCubes = 0;
    cResult->pCubes = Vec_IntFetch( vMemory, nCubes );
    // add the cubes
//    Vec_IntForEachEntry( vInput, uCube, i )
    for ( i = 0; i < nCubes; i++ )
    {
        uCube = Vec_IntEntry( vInput, i );
        uMask = ((uCube | (uCube >> 1)) & 0x55555555);
        uMask |= (uMask << 1);
        Kit_SopPushCube( cResult, uCube ^ uMask );
    }
}